

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

void __thiscall blas::quaternion::quaternion(quaternion *this,initializer_list<float> list)

{
  long lVar1;
  float *pfVar2;
  
  pfVar2 = list._M_array;
  (this->data).super_matrix<4UL,_1UL>.data[0] = 0.0;
  (this->data).super_matrix<4UL,_1UL>.data[1] = 0.0;
  (this->data).super_matrix<4UL,_1UL>.data[2] = 0.0;
  (this->data).super_matrix<4UL,_1UL>.data[3] = 0.0;
  (this->data).super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  if (list._M_len != 3) {
    if (list._M_len == 4) {
      lVar1 = 0;
      do {
        *(undefined4 *)((long)(this->data).super_matrix<4UL,_1UL>.data[0] + lVar1) =
             *(undefined4 *)((long)pfVar2 + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 0x10);
    }
    return;
  }
  (this->data).super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  (this->data).super_matrix<4UL,_1UL>.data[1][0] = *pfVar2;
  (this->data).super_matrix<4UL,_1UL>.data[2][0] = pfVar2[1];
  (this->data).super_matrix<4UL,_1UL>.data[3][0] = pfVar2[2];
  return;
}

Assistant:

matrix() = default;